

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TraceStats * __thiscall
perfetto::TracingServiceImpl::GetTraceStats
          (TraceStats *__return_storage_ptr__,TracingServiceImpl *this,
          TracingSession *tracing_session)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  TraceStats_FilterStats *this_00;
  reference puVar6;
  TraceBuffer *this_01;
  BufferStats *pBVar7;
  TraceStats_BufferStats *this_02;
  TraceBuffer *buf;
  iterator iStack_58;
  BufferID buf_id;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  TraceStats_FilterStats *filt_stats;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  TraceStats *trace_stats;
  
  protos::gen::TraceStats::TraceStats(__return_storage_ptr__);
  sVar2 = std::
          map<unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>_>
          ::size(&this->producers_);
  protos::gen::TraceStats::set_producers_connected(__return_storage_ptr__,(uint32_t)sVar2);
  protos::gen::TraceStats::set_producers_seen(__return_storage_ptr__,(ulong)this->last_producer_id_)
  ;
  sVar3 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
          ::size(&this->data_sources_);
  protos::gen::TraceStats::set_data_sources_registered(__return_storage_ptr__,(uint32_t)sVar3);
  protos::gen::TraceStats::set_data_sources_seen
            (__return_storage_ptr__,this->last_data_source_instance_id_);
  sVar4 = std::
          map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
          ::size(&this->tracing_sessions_);
  protos::gen::TraceStats::set_tracing_sessions(__return_storage_ptr__,(uint32_t)sVar4);
  sVar5 = std::
          map<unsigned_short,_std::unique_ptr<perfetto::TraceBuffer,_std::default_delete<perfetto::TraceBuffer>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<perfetto::TraceBuffer,_std::default_delete<perfetto::TraceBuffer>_>_>_>_>
          ::size(&this->buffers_);
  protos::gen::TraceStats::set_total_buffers(__return_storage_ptr__,(uint32_t)sVar5);
  protos::gen::TraceStats::set_chunks_discarded(__return_storage_ptr__,this->chunks_discarded_);
  protos::gen::TraceStats::set_patches_discarded(__return_storage_ptr__,this->patches_discarded_);
  protos::gen::TraceStats::set_invalid_packets
            (__return_storage_ptr__,tracing_session->invalid_packets);
  protos::gen::TraceStats::set_flushes_requested
            (__return_storage_ptr__,tracing_session->flushes_requested);
  protos::gen::TraceStats::set_flushes_succeeded
            (__return_storage_ptr__,tracing_session->flushes_succeeded);
  protos::gen::TraceStats::set_flushes_failed
            (__return_storage_ptr__,tracing_session->flushes_failed);
  protos::gen::TraceStats::set_final_flush_outcome
            (__return_storage_ptr__,tracing_session->final_flush_outcome);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&tracing_session->trace_filter);
  if (bVar1) {
    this_00 = protos::gen::TraceStats::mutable_filter_stats(__return_storage_ptr__);
    protos::gen::TraceStats_FilterStats::set_input_packets
              (this_00,tracing_session->filter_input_packets);
    protos::gen::TraceStats_FilterStats::set_input_bytes
              (this_00,tracing_session->filter_input_bytes);
    protos::gen::TraceStats_FilterStats::set_output_bytes
              (this_00,tracing_session->filter_output_bytes);
    protos::gen::TraceStats_FilterStats::set_errors(this_00,tracing_session->filter_errors);
  }
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (&tracing_session->buffers_index);
  iStack_58 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                        (&tracing_session->buffers_index);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8), bVar1) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    this_01 = GetBufferByID(this,*puVar6);
    if (this_01 == (TraceBuffer *)0x0) {
      perfetto::base::ignore_result<char[18]>((char (*) [18])"Buffer not found.");
    }
    else {
      pBVar7 = TraceBuffer::stats(this_01);
      this_02 = protos::gen::TraceStats::add_buffer_stats(__return_storage_ptr__);
      protos::gen::TraceStats_BufferStats::operator=(this_02,pBVar7);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

TraceStats TracingServiceImpl::GetTraceStats(TracingSession* tracing_session) {
  TraceStats trace_stats;
  trace_stats.set_producers_connected(static_cast<uint32_t>(producers_.size()));
  trace_stats.set_producers_seen(last_producer_id_);
  trace_stats.set_data_sources_registered(
      static_cast<uint32_t>(data_sources_.size()));
  trace_stats.set_data_sources_seen(last_data_source_instance_id_);
  trace_stats.set_tracing_sessions(
      static_cast<uint32_t>(tracing_sessions_.size()));
  trace_stats.set_total_buffers(static_cast<uint32_t>(buffers_.size()));
  trace_stats.set_chunks_discarded(chunks_discarded_);
  trace_stats.set_patches_discarded(patches_discarded_);
  trace_stats.set_invalid_packets(tracing_session->invalid_packets);
  trace_stats.set_flushes_requested(tracing_session->flushes_requested);
  trace_stats.set_flushes_succeeded(tracing_session->flushes_succeeded);
  trace_stats.set_flushes_failed(tracing_session->flushes_failed);
  trace_stats.set_final_flush_outcome(tracing_session->final_flush_outcome);

  if (tracing_session->trace_filter) {
    auto* filt_stats = trace_stats.mutable_filter_stats();
    filt_stats->set_input_packets(tracing_session->filter_input_packets);
    filt_stats->set_input_bytes(tracing_session->filter_input_bytes);
    filt_stats->set_output_bytes(tracing_session->filter_output_bytes);
    filt_stats->set_errors(tracing_session->filter_errors);
  }

  for (BufferID buf_id : tracing_session->buffers_index) {
    TraceBuffer* buf = GetBufferByID(buf_id);
    if (!buf) {
      PERFETTO_DFATAL("Buffer not found.");
      continue;
    }
    *trace_stats.add_buffer_stats() = buf->stats();
  }  // for (buf in session).
  return trace_stats;
}